

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdManFree(Kit_DsdMan_t *p)

{
  Kit_DsdMan_t *p_local;
  
  Cloud_Quit(p->dd);
  Vec_IntFree(p->vNodes);
  Vec_PtrFree(p->vTtBdds);
  Vec_PtrFree(p->vTtElems);
  Vec_PtrFree(p->vTtNodes);
  if (p != (Kit_DsdMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Kit_DsdManFree( Kit_DsdMan_t * p )
{
    Cloud_Quit( p->dd );
    Vec_IntFree( p->vNodes );
    Vec_PtrFree( p->vTtBdds );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}